

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

_Bool is_invalid_status_code(uint16_t status_code)

{
  undefined1 local_9;
  uint16_t status_code_local;
  
  if ((status_code < 1000) || (0x3eb < status_code)) {
    if ((status_code < 0x3ef) || (0x3f3 < status_code)) {
      if ((status_code < 3000) || (4999 < status_code)) {
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool is_invalid_status_code(uint16_t status_code)
{
	if ((status_code >= CIO_WEBSOCKET_CLOSE_NORMAL) && (status_code <= CIO_WEBSOCKET_CLOSE_UNSUPPORTED)) {
		return false;
	}

	if ((status_code >= CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA) && (status_code <= CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR)) {
		return false;
	}

	if ((status_code >= CIO_WEBSOCKET_CLOSE_RESERVED_LOWER_BOUND) && (status_code <= CIO_WEBSOCKET_CLOSE_RESERVED_UPPER_BOUND)) {
		return false;
	}

	return true;
}